

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeRegVmLowerGraph.cpp
# Opt level: O2

void PrintFunction(InstructionRegVmLowerGraphContext *ctx,RegVmLoweredModule *lowModule,
                  RegVmLoweredFunction *lowFunction)

{
  FunctionData *pFVar1;
  char *pcVar2;
  char *pcVar3;
  ScopeData *pSVar4;
  VariableData *pVVar5;
  VmConstant *pVVar6;
  VmValue *pVVar7;
  ModuleData *pMVar8;
  bool bVar9;
  uint uVar10;
  ArgumentData *pAVar11;
  VariableData **ppVVar12;
  VmConstant **ppVVar13;
  VmValue **ppVVar14;
  RegVmLoweredBlock **ppRVar15;
  char *pcVar16;
  char *pcVar17;
  uint i_1;
  bool bVar18;
  uint i;
  uint uVar19;
  uint index;
  uint index_00;
  
  pFVar1 = lowFunction->vmFunction->function;
  if (pFVar1 == (FunctionData *)0x0) {
    PrintLine(ctx->output,"function global()");
  }
  else {
    pcVar17 = (pFVar1->name->name).begin;
    Print(ctx->output,"function %.*s.f%04x(",
          (ulong)(uint)(*(int *)&(pFVar1->name->name).end - (int)pcVar17),pcVar17,
          (ulong)pFVar1->uniqueId);
    for (uVar19 = 0; uVar19 < (pFVar1->arguments).count; uVar19 = uVar19 + 1) {
      pAVar11 = SmallArray<ArgumentData,_4U>::operator[](&pFVar1->arguments,uVar19);
      pcVar17 = ", ";
      if (uVar19 == 0) {
        pcVar17 = "";
      }
      pcVar16 = "";
      if (pAVar11->isExplicit != false) {
        pcVar16 = "explicit ";
      }
      pcVar2 = (pAVar11->type->name).begin;
      pcVar3 = (pAVar11->name->name).begin;
      Print(ctx->output,"%s%s%.*s %.*s",pcVar17,pcVar16,
            (ulong)(uint)(*(int *)&(pAVar11->type->name).end - (int)pcVar2),pcVar2,
            (ulong)(uint)(*(int *)&(pAVar11->name->name).end - (int)pcVar3),pcVar3);
    }
    PrintLine(ctx->output,")");
    PrintLine(ctx->output,"// argument size %lld",pFVar1->argumentsSize);
    PrintLine(ctx->output,"// stack size %lld",pFVar1->stackSize);
    uVar19 = pFVar1->vmFunction->regVmRegisters;
    PrintLine(ctx->output,"// register count %d (r0-r%d)",(ulong)uVar19,(ulong)(uVar19 - 1));
  }
  pSVar4 = lowFunction->vmFunction->scope;
  if (pSVar4 != (ScopeData *)0x0) {
    for (uVar19 = 0; uVar19 < (pSVar4->allVariables).count; uVar19 = uVar19 + 1) {
      ppVVar12 = SmallArray<VariableData_*,_4U>::operator[](&pSVar4->allVariables,uVar19);
      pVVar5 = *ppVVar12;
      if ((pVVar5->isAlloca != true) || ((pVVar5->users).count != 0)) {
        pcVar17 = "imported ";
        if (pVVar5->importModule == (ModuleData *)0x0) {
          pcVar17 = "";
        }
        pcVar16 = (pVVar5->type->name).begin;
        pcVar2 = (pVVar5->name->name).begin;
        bVar18 = false;
        Print(ctx->output,"// %s0x%x: %.*s %.*s",pcVar17,(ulong)pVVar5->offset,
              (ulong)(uint)(*(int *)&(pVVar5->type->name).end - (int)pcVar16),pcVar16,
              (ulong)(uint)(*(int *)&(pVVar5->name->name).end - (int)pcVar2),pcVar2);
        for (index = 0; index < (pVVar5->users).count; index = index + 1) {
          ppVVar13 = SmallArray<VmConstant_*,_8U>::operator[](&pVVar5->users,index);
          pVVar6 = *ppVVar13;
          for (index_00 = 0; index_00 < (pVVar6->super_VmValue).users.count; index_00 = index_00 + 1
              ) {
            ppVVar14 = SmallArray<VmValue_*,_8U>::operator[]
                                 (&(pVVar6->super_VmValue).users,index_00);
            pVVar7 = *ppVVar14;
            if ((pVVar7 == (VmValue *)0x0) || (pVVar7->typeID != 2)) {
              __assert_fail("!\"invalid constant use\"",
                            "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeRegVmLowerGraph.cpp"
                            ,0x3a3,
                            "void PrintFunction(InstructionRegVmLowerGraphContext &, RegVmLoweredModule *, RegVmLoweredFunction *)"
                           );
            }
            uVar10 = *(uint *)&pVVar7[1]._vptr_VmValue;
            if (uVar10 < 7) {
LAB_001852fa:
              bVar9 = bVar18;
            }
            else {
              if (uVar10 - 8 < 7) {
                ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                     ((SmallArray<VmValue_*,_4U> *)&pVVar7[1].typeID,0);
                if ((VmConstant *)*ppVVar14 == pVVar6) goto LAB_001852fa;
                uVar10 = *(uint *)&pVVar7[1]._vptr_VmValue;
              }
              if (uVar10 == 0x1b) {
                ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                     ((SmallArray<VmValue_*,_4U> *)&pVVar7[1].typeID,0);
                if (((VmConstant *)*ppVVar14 == pVVar6) ||
                   (ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                         ((SmallArray<VmValue_*,_4U> *)&pVVar7[1].typeID,2),
                   (VmConstant *)*ppVVar14 == pVVar6)) goto LAB_001852fa;
                uVar10 = *(uint *)&pVVar7[1]._vptr_VmValue;
              }
              if (uVar10 == 0x1a) {
                ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                     ((SmallArray<VmValue_*,_4U> *)&pVVar7[1].typeID,0);
                if ((VmConstant *)*ppVVar14 == pVVar6) goto LAB_001852fa;
                uVar10 = *(uint *)&pVVar7[1]._vptr_VmValue;
              }
              if (uVar10 - 0x1f < 2) {
                bVar9 = true;
                if (pVVar6->isReference != false) goto LAB_001852fa;
              }
              else {
                bVar9 = true;
                if ((uVar10 - 0x33 < 0x11) &&
                   (ppVVar14 = SmallArray<VmValue_*,_4U>::operator[]
                                         ((SmallArray<VmValue_*,_4U> *)&pVVar7[1].typeID,1),
                   (VmConstant *)*ppVVar14 == pVVar6)) goto LAB_001852fa;
              }
            }
            bVar18 = bVar9;
          }
        }
        if (!bVar18) {
          Print(ctx->output," noalias");
        }
        if (pVVar5->isAlloca == true) {
          Print(ctx->output," alloca");
        }
        pMVar8 = pVVar5->importModule;
        if (pMVar8 != (ModuleData *)0x0) {
          Print(ctx->output," from \'%.*s\'",
                (ulong)(uint)(*(int *)&(pMVar8->name).end - (int)(pMVar8->name).begin));
        }
        PrintLine(ctx->output);
      }
    }
  }
  PrintLine(ctx->output,"{");
  for (uVar19 = 0; uVar19 < (lowFunction->blocks).count; uVar19 = uVar19 + 1) {
    ppRVar15 = SmallArray<RegVmLoweredBlock_*,_16U>::operator[](&lowFunction->blocks,uVar19);
    PrintBlock(ctx,lowModule,*ppRVar15);
  }
  PrintLine(ctx->output,"}");
  PrintLine(ctx->output);
  return;
}

Assistant:

void PrintFunction(InstructionRegVmLowerGraphContext &ctx, RegVmLoweredModule *lowModule, RegVmLoweredFunction *lowFunction)
{
	if(FunctionData *fData = lowFunction->vmFunction->function)
	{
		Print(ctx.output, "function %.*s.f%04x(", FMT_ISTR(fData->name->name), fData->uniqueId);

		for(unsigned i = 0; i < fData->arguments.size(); i++)
		{
			ArgumentData &argument = fData->arguments[i];

			Print(ctx.output, "%s%s%.*s %.*s", i == 0 ? "" : ", ", argument.isExplicit ? "explicit " : "", FMT_ISTR(argument.type->name), FMT_ISTR(argument.name->name));
		}

		PrintLine(ctx.output, ")");

		PrintLine(ctx.output, "// argument size %lld", fData->argumentsSize);
		PrintLine(ctx.output, "// stack size %lld", fData->stackSize);
		PrintLine(ctx.output, "// register count %d (r0-r%d)", fData->vmFunction->regVmRegisters, fData->vmFunction->regVmRegisters - 1);
	}
	else
	{
		PrintLine(ctx.output, "function global()");
	}

	if(ScopeData *scope = lowFunction->vmFunction->scope)
	{
		for(unsigned i = 0; i < scope->allVariables.size(); i++)
		{
			VariableData *variable = scope->allVariables[i];

			if(variable->isAlloca && variable->users.empty())
				continue;

			Print(ctx.output, "// %s0x%x: %.*s %.*s", variable->importModule ? "imported " : "", variable->offset, FMT_ISTR(variable->type->name), FMT_ISTR(variable->name->name));

			bool addressTaken = false;

			for(unsigned i = 0; i < variable->users.size(); i++)
			{
				VmConstant *user = variable->users[i];

				for(unsigned k = 0; k < user->users.size(); k++)
				{
					if(VmInstruction *inst = getType<VmInstruction>(user->users[k]))
					{
						bool simpleUse = false;

						if(inst->cmd >= VM_INST_LOAD_BYTE && inst->cmd <= VM_INST_LOAD_STRUCT)
							simpleUse = true;
						else if(inst->cmd >= VM_INST_STORE_BYTE && inst->cmd <= VM_INST_STORE_STRUCT && inst->arguments[0] == user)
							simpleUse = true;
						else if(inst->cmd == VM_INST_MEM_COPY && (inst->arguments[0] == user || inst->arguments[2] == user))
							simpleUse = true;
						else if(inst->cmd == VM_INST_SET_RANGE && inst->arguments[0] == user)
							simpleUse = true;
						else if((inst->cmd == VM_INST_RETURN || inst->cmd == VM_INST_CALL) && user->isReference)
							simpleUse = true;
						else if(inst->cmd >= VM_INST_ADD_LOAD && inst->cmd <= VM_INST_BIT_XOR_LOAD && inst->arguments[1] == user)
							simpleUse = true;
						else
							simpleUse = false;

						if(!simpleUse)
							addressTaken = true;
					}
					else
					{
						assert(!"invalid constant use");
					}
				}
			}

			if(!addressTaken)
				Print(ctx.output, " noalias");

			if(variable->isAlloca)
				Print(ctx.output, " alloca");

			if(variable->importModule)
				Print(ctx.output, " from '%.*s'", FMT_ISTR(variable->importModule->name));

			PrintLine(ctx.output);
		}
	}

	PrintLine(ctx.output, "{");

	for(unsigned i = 0; i < lowFunction->blocks.size(); i++)
		PrintBlock(ctx, lowModule, lowFunction->blocks[i]);

	PrintLine(ctx.output, "}");
	PrintLine(ctx.output);
}